

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.cxx
# Opt level: O0

int iterateLife(Bitmap *pixels)

{
  OledPoint p_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  long *in_RDI;
  int n;
  bool live;
  Point p;
  int col;
  int row;
  Bitmap last;
  int population;
  OledBitmap<128,_64> *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  Point<int> in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  int in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  Point<int> local_438;
  int local_430;
  int local_41c;
  int local_c;
  long *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  SSD1306::OledBitmap<128,_64>::OledBitmap
            ((OledBitmap<128,_64> *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb78);
  for (local_41c = 0; iVar1 = local_41c, iVar3 = (**(code **)(*local_8 + 0x48))(), iVar1 < iVar3;
      local_41c = local_41c + 1) {
    for (local_430 = 0; iVar1 = local_430, iVar3 = (**(code **)(*local_8 + 0x40))(), iVar1 < iVar3;
        local_430 = local_430 + 1) {
      SSD1306::Point<int>::Point(&local_438,local_430,local_41c);
      p_00.m_y = in_stack_fffffffffffffbb0;
      p_00.m_x = in_stack_fffffffffffffbac;
      bVar2 = SSD1306::OledBitmap<128,_64>::isSetPixel
                        ((OledBitmap<128,_64> *)in_stack_fffffffffffffba0,p_00);
      in_stack_fffffffffffffbb4 =
           neighbours((OledPixel *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      in_stack_fffffffffffffbac,in_stack_fffffffffffffba8);
      if (in_stack_fffffffffffffbb4 < 2) {
        bVar2 = false;
      }
      else if ((bVar2) && (in_stack_fffffffffffffbb4 == 2)) {
        bVar2 = true;
      }
      else {
        bVar2 = in_stack_fffffffffffffbb4 == 3;
      }
      if (bVar2) {
        local_c = local_c + 1;
        in_stack_fffffffffffffba8 = local_438.m_x;
        in_stack_fffffffffffffbac = local_438.m_y;
        (**(code **)(*local_8 + 0x28))(local_8,local_438);
      }
      else {
        in_stack_fffffffffffffba0 = local_438;
        (**(code **)(*local_8 + 0x30))(local_8,local_438);
      }
    }
  }
  SSD1306::OledBitmap<128,_64>::~OledBitmap((OledBitmap<128,_64> *)0x107926);
  return local_c;
}

Assistant:

int
iterateLife(
    Bitmap& pixels)
{
    int population = 0;
    Bitmap last = pixels;

    for (auto row = 0 ; row < pixels.height() ; ++row)
    {
        for (auto col = 0 ; col < pixels.width() ; ++col)
        {
            Point p{col, row};
            bool live = last.isSetPixel(p);
            int n = neighbours(last, col, row);

            if (n < 2)
            {
                live = false;
            }
            else if (live && (n == 2))
            {
                live = true;
            }
            else if (n == 3)
            {
                live = true;
            }
            else
            {
                live = false;
            }

            if (live)
            {
                ++population;

                pixels.setPixel(p);
            }
            else
            {
                pixels.unsetPixel(p);
            }
        }
    }

    return population;
}